

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sys_rand.c
# Opt level: O0

int randombytes_linux_getrandom(void *buf_,size_t size)

{
  int iVar1;
  ulong in_RSI;
  void *in_RDI;
  size_t chunk_size;
  uchar *buf;
  ulong size_00;
  ulong local_18;
  
  size_00 = 0x100;
  local_18 = in_RSI;
  while( true ) {
    if (local_18 < size_00) {
      size_00 = local_18;
    }
    iVar1 = _randombytes_linux_getrandom(in_RDI,size_00);
    if (iVar1 != 0) break;
    local_18 = local_18 - size_00;
    in_RDI = (void *)(size_00 + (long)in_RDI);
    if (local_18 == 0) {
      return 0;
    }
  }
  return -1;
}

Assistant:

static int randombytes_linux_getrandom(void * const buf_, size_t size)
{
    unsigned char *buf = (unsigned char *) buf_;
    size_t         chunk_size = 256U;

    do {
        if (size < chunk_size) 
        {
            chunk_size = size;
            assert(chunk_size > (size_t) 0U);
        }
        if (_randombytes_linux_getrandom(buf, chunk_size) != 0) 
        {
            return -1;
        }
        size -= chunk_size;
        buf += chunk_size;
    } while (size > (size_t) 0U);

    return 0;
}